

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void createFallbackDecorations(_GLFWwindow *window)

{
  wl_buffer *pwVar1;
  undefined1 local_28 [8];
  GLFWimage image;
  uchar data [4];
  _GLFWwindow *window_local;
  
  image.pixels._4_4_ = 0xffe0e0e0;
  local_28._0_4_ = 1;
  local_28._4_4_ = 1;
  image._0_8_ = (long)&image.pixels + 4;
  if (_glfw.wl.viewporter != (wp_viewporter *)0x0) {
    if ((window->wl).fallback.buffer == (wl_buffer *)0x0) {
      pwVar1 = createShmBuffer((GLFWimage *)local_28);
      (window->wl).fallback.buffer = pwVar1;
    }
    if ((window->wl).fallback.buffer != (wl_buffer *)0x0) {
      createFallbackEdge(window,&(window->wl).fallback.top,(window->wl).surface,
                         (window->wl).fallback.buffer,0,-0x18,(window->wl).width,0x18);
      createFallbackEdge(window,&(window->wl).fallback.left,(window->wl).surface,
                         (window->wl).fallback.buffer,-4,-0x18,4,(window->wl).height + 0x18);
      createFallbackEdge(window,&(window->wl).fallback.right,(window->wl).surface,
                         (window->wl).fallback.buffer,(window->wl).width,-0x18,4,
                         (window->wl).height + 0x18);
      createFallbackEdge(window,&(window->wl).fallback.bottom,(window->wl).surface,
                         (window->wl).fallback.buffer,-4,(window->wl).height,(window->wl).width + 8,
                         4);
      (window->wl).fallback.decorations = 1;
    }
  }
  return;
}

Assistant:

static void createFallbackDecorations(_GLFWwindow* window)
{
    unsigned char data[] = { 224, 224, 224, 255 };
    const GLFWimage image = { 1, 1, data };

    if (!_glfw.wl.viewporter)
        return;

    if (!window->wl.fallback.buffer)
        window->wl.fallback.buffer = createShmBuffer(&image);
    if (!window->wl.fallback.buffer)
        return;

    createFallbackEdge(window, &window->wl.fallback.top, window->wl.surface,
                       window->wl.fallback.buffer,
                       0, -GLFW_CAPTION_HEIGHT,
                       window->wl.width, GLFW_CAPTION_HEIGHT);
    createFallbackEdge(window, &window->wl.fallback.left, window->wl.surface,
                       window->wl.fallback.buffer,
                       -GLFW_BORDER_SIZE, -GLFW_CAPTION_HEIGHT,
                       GLFW_BORDER_SIZE, window->wl.height + GLFW_CAPTION_HEIGHT);
    createFallbackEdge(window, &window->wl.fallback.right, window->wl.surface,
                       window->wl.fallback.buffer,
                       window->wl.width, -GLFW_CAPTION_HEIGHT,
                       GLFW_BORDER_SIZE, window->wl.height + GLFW_CAPTION_HEIGHT);
    createFallbackEdge(window, &window->wl.fallback.bottom, window->wl.surface,
                       window->wl.fallback.buffer,
                       -GLFW_BORDER_SIZE, window->wl.height,
                       window->wl.width + GLFW_BORDER_SIZE * 2, GLFW_BORDER_SIZE);

    window->wl.fallback.decorations = GLFW_TRUE;
}